

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall
google::protobuf::FileDescriptorTables::AddEnumValueByNumber
          (FileDescriptorTables *this,EnumValueDescriptor *value)

{
  int iVar1;
  int iVar2;
  EnumDescriptor *pEVar3;
  EnumValueDescriptor *this_00;
  long lVar4;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>::iterator,_bool>
  local_40;
  int local_24;
  EnumValueDescriptor *pEStack_20;
  int base;
  EnumValueDescriptor *value_local;
  FileDescriptorTables *this_local;
  
  pEStack_20 = value;
  value_local = (EnumValueDescriptor *)this;
  pEVar3 = EnumValueDescriptor::type(value);
  this_00 = EnumDescriptor::value(pEVar3,0);
  iVar1 = EnumValueDescriptor::number(this_00);
  local_24 = iVar1;
  iVar2 = EnumValueDescriptor::number(pEStack_20);
  if (iVar1 <= iVar2) {
    iVar1 = EnumValueDescriptor::number(pEStack_20);
    lVar4 = (long)local_24;
    pEVar3 = EnumValueDescriptor::type(pEStack_20);
    if ((long)iVar1 <= lVar4 + pEVar3->sequential_value_limit_) {
      return true;
    }
  }
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
  ::insert<google::protobuf::EnumValueDescriptor_*,_0>
            (&local_40,
             &(this->enum_values_by_number_).
              super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
             ,&stack0xffffffffffffffe0);
  return (bool)(local_40.second & 1);
}

Assistant:

bool FileDescriptorTables::AddEnumValueByNumber(EnumValueDescriptor* value) {
  // Skip values that are at the start of the sequence.
  const int base = value->type()->value(0)->number();
  if (base <= value->number() &&
      value->number() <=
          static_cast<int64_t>(base) + value->type()->sequential_value_limit_)
    return true;
  return enum_values_by_number_.insert(value).second;
}